

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_transport.c
# Opt level: O2

int find_transport_in_cm(CManager cm,char *trans_name)

{
  int iVar1;
  transport_entry_conflict *pp_Var2;
  
  pp_Var2 = cm->transports;
  iVar1 = 0;
  if (pp_Var2 != (transport_entry_conflict *)0x0) {
    do {
      if (*pp_Var2 == (transport_entry_conflict)0x0) {
        return 0;
      }
      iVar1 = strcmp((*pp_Var2)->trans_name,trans_name);
      pp_Var2 = pp_Var2 + 1;
    } while (iVar1 != 0);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int
find_transport_in_cm(CManager cm, const char *trans_name)
{
    int i = 0;
    if (cm->transports == NULL)
	return 0;
    while (cm->transports[i] != NULL) {
	if (strcmp(cm->transports[i]->trans_name, trans_name) == 0)
	    return 1;
	i++;
    }
    return 0;
}